

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O2

double deqp::gles31::Functional::FmaCase::fma(double __x,double __y,double __z)

{
  FloatFormat *this;
  bool bVar1;
  bool bVar2;
  double dVar3;
  bool bVar4;
  int in_ESI;
  Interval *in_RDI;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double extraout_XMM0_Qa;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double local_238;
  double local_228;
  ScopedRoundingMode tmp_ctx_;
  double local_210;
  double local_208;
  Interval ib;
  Interval ia;
  Interval ic;
  Interval local_118;
  Interval local_100;
  double local_e8;
  undefined8 uStack_e0;
  double local_d8;
  undefined8 uStack_d0;
  Interval local_c0;
  FloatFormat local_a8 [3];
  
  tcu::FloatFormat::FloatFormat(local_a8,0,0,7,false,YES,MAYBE,MAYBE);
  tcu::FloatFormat::FloatFormat(local_a8 + 1,-0xd,0xd,9,false,MAYBE,MAYBE,MAYBE);
  tcu::FloatFormat::FloatFormat(local_a8 + 2,-0x7e,0x7f,0x17,true,MAYBE,YES,MAYBE);
  ib.m_hasNaN = NAN(SUB84(__x,0));
  dVar11 = (double)SUB84(__x,0);
  local_238 = INFINITY;
  ib.m_lo = INFINITY;
  if (!ib.m_hasNaN) {
    ib.m_lo = dVar11;
  }
  this = local_a8 + in_ESI;
  local_228 = -INFINITY;
  ib.m_hi = -INFINITY;
  if (!ib.m_hasNaN) {
    ib.m_hi = dVar11;
  }
  tcu::FloatFormat::convert(&ia,this,&ib);
  ic.m_hasNaN = NAN(SUB84(__y,0));
  ic.m_lo = INFINITY;
  ic.m_hi = -INFINITY;
  if (!ic.m_hasNaN) {
    ic.m_lo = (double)SUB84(__y,0);
    ic.m_hi = ic.m_lo;
  }
  tcu::FloatFormat::convert(&ib,this,&ic);
  local_118.m_hasNaN = NAN(SUB84(__z,0));
  if (!local_118.m_hasNaN) {
    local_238 = (double)SUB84(__z,0);
    local_228 = local_238;
  }
  local_118.m_lo = local_238;
  local_118.m_hi = local_228;
  tcu::FloatFormat::convert(&ic,this,&local_118);
  local_118.m_hasNaN = false;
  local_118.m_lo = INFINITY;
  local_118.m_hi = -INFINITY;
  tmp_ctx_.m_oldMode = deGetRoundingMode();
  deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
  dVar16 = ia.m_lo;
  dVar11 = ib.m_lo;
  deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
  dVar16 = dVar16 * dVar11;
  bVar4 = NAN(dVar16);
  dVar11 = -INFINITY;
  if (!bVar4) {
    dVar11 = dVar16;
  }
  dVar14 = INFINITY;
  if (!bVar4) {
    dVar14 = dVar16;
  }
  dVar6 = ia.m_lo * ib.m_lo;
  dVar16 = -INFINITY;
  dVar10 = INFINITY;
  if (!NAN(dVar6)) {
    dVar16 = dVar6;
    dVar10 = dVar6;
  }
  tcu::ScopedRoundingMode::~ScopedRoundingMode(&tmp_ctx_);
  tmp_ctx_.m_oldMode = deGetRoundingMode();
  deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
  dVar7 = ia.m_lo;
  dVar12 = ib.m_hi;
  deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
  dVar7 = dVar7 * dVar12;
  dVar12 = -INFINITY;
  if (!NAN(dVar7)) {
    dVar12 = dVar7;
  }
  dVar8 = ia.m_lo * ib.m_hi;
  dVar13 = INFINITY;
  if (!NAN(dVar8)) {
    dVar13 = dVar8;
  }
  tcu::ScopedRoundingMode::~ScopedRoundingMode(&tmp_ctx_);
  tmp_ctx_.m_oldMode = deGetRoundingMode();
  deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
  dVar9 = ia.m_hi;
  dVar18 = ib.m_lo;
  deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
  dVar9 = dVar9 * dVar18;
  dVar18 = -INFINITY;
  if (!NAN(dVar9)) {
    dVar18 = dVar9;
  }
  local_d8 = ia.m_hi * ib.m_lo;
  local_e8 = INFINITY;
  if (!NAN(local_d8)) {
    local_e8 = local_d8;
  }
  uStack_e0 = 0;
  uStack_d0 = 0;
  tcu::ScopedRoundingMode::~ScopedRoundingMode(&tmp_ctx_);
  tmp_ctx_.m_oldMode = deGetRoundingMode();
  deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
  dVar17 = ia.m_hi;
  dVar3 = ib.m_hi;
  deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
  dVar15 = (double)(-(ulong)NAN(dVar7) & 0x7ff0000000000000 | ~-(ulong)NAN(dVar7) & (ulong)dVar7);
  dVar19 = (double)(~-(ulong)NAN(dVar8) & (ulong)dVar8 | -(ulong)NAN(dVar8) & 0xfff0000000000000);
  dVar20 = (double)(~-(ulong)(dVar14 <= dVar10) & (ulong)dVar10 |
                   (ulong)dVar14 & -(ulong)(dVar14 <= dVar10));
  dVar21 = (double)(~-(ulong)(dVar16 <= dVar11) & (ulong)dVar16 |
                   (ulong)dVar11 & -(ulong)(dVar16 <= dVar11));
  uVar5 = -(ulong)(dVar15 <= dVar13);
  dVar10 = (double)(~uVar5 & (ulong)dVar13 | uVar5 & (ulong)dVar15);
  uVar5 = -(ulong)(dVar19 <= dVar12);
  dVar14 = (double)(~uVar5 & (ulong)dVar19 | (ulong)dVar12 & uVar5);
  dVar11 = (double)(-(ulong)NAN(dVar9) & 0x7ff0000000000000 | ~-(ulong)NAN(dVar9) & (ulong)dVar9);
  dVar16 = (double)(~-(ulong)NAN(local_d8) & (ulong)local_d8 |
                   -(ulong)NAN(local_d8) & 0xfff0000000000000);
  uVar5 = -(ulong)(dVar11 <= local_e8);
  bVar1 = NAN(local_d8);
  dVar12 = (double)(~uVar5 & (ulong)local_e8 | uVar5 & (ulong)dVar11);
  uVar5 = -(ulong)(dVar16 <= dVar18);
  dVar17 = dVar17 * dVar3;
  bVar2 = NAN(dVar17);
  dVar11 = (double)(~uVar5 & (ulong)dVar16 | (ulong)dVar18 & uVar5);
  dVar16 = -INFINITY;
  if (!bVar2) {
    dVar16 = dVar17;
  }
  dVar13 = INFINITY;
  if (!bVar2) {
    dVar13 = dVar17;
  }
  dVar19 = ia.m_hi * ib.m_hi;
  dVar18 = -INFINITY;
  dVar15 = INFINITY;
  if (!NAN(dVar19)) {
    dVar18 = dVar19;
    dVar15 = dVar19;
  }
  dVar13 = (double)(~-(ulong)(dVar13 <= dVar15) & (ulong)dVar15 |
                   (ulong)dVar13 & -(ulong)(dVar13 <= dVar15));
  dVar16 = (double)(~-(ulong)(dVar18 <= dVar16) & (ulong)dVar18 |
                   (ulong)dVar16 & -(ulong)(dVar18 <= dVar16));
  tcu::ScopedRoundingMode::~ScopedRoundingMode(&tmp_ctx_);
  uVar5 = -(ulong)(dVar20 <= dVar10);
  dVar10 = (double)(~uVar5 & (ulong)dVar10 | uVar5 & (ulong)dVar20);
  uVar5 = -(ulong)(dVar14 <= dVar21);
  dVar14 = (double)(~uVar5 & (ulong)dVar14 | uVar5 & (ulong)dVar21);
  uVar5 = -(ulong)(dVar10 <= dVar12);
  dVar10 = (double)(~uVar5 & (ulong)dVar12 | uVar5 & (ulong)dVar10);
  uVar5 = -(ulong)(dVar11 <= dVar14);
  dVar11 = (double)(~uVar5 & (ulong)dVar11 | uVar5 & (ulong)dVar14);
  local_100.m_hasNaN =
       (bVar2 || NAN(dVar19)) ||
       (((NAN(dVar8) || NAN(dVar9)) || bVar1) || ((bVar4 || NAN(dVar6)) || NAN(dVar7)));
  uVar5 = -(ulong)(dVar10 <= dVar13);
  local_100.m_lo = (double)(uVar5 & (ulong)dVar10 | ~uVar5 & (ulong)dVar13);
  uVar5 = -(ulong)(dVar16 <= dVar11);
  local_100.m_hi = (double)(uVar5 & (ulong)dVar11 | ~uVar5 & (ulong)dVar16);
  bVar4 = false;
  if ((ia.m_lo != -INFINITY) && (bVar4 = false, ia.m_hi != INFINITY)) {
    bVar4 = ib.m_hi != INFINITY && ib.m_lo != -INFINITY;
  }
  tcu::FloatFormat::roundOut(&local_c0,this,&local_100,bVar4);
  tcu::FloatFormat::convert((Interval *)&tmp_ctx_,this,&local_c0);
  tmp_ctx_.m_oldMode = deGetRoundingMode();
  deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
  dVar11 = ic.m_lo;
  deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
  dVar11 = dVar11 + local_210;
  local_118.m_hasNaN = NAN(dVar11);
  dVar16 = -INFINITY;
  if (!local_118.m_hasNaN) {
    dVar16 = dVar11;
  }
  dVar14 = INFINITY;
  if (!local_118.m_hasNaN) {
    dVar14 = dVar11;
  }
  dVar6 = ic.m_hi + local_208;
  dVar11 = -INFINITY;
  dVar10 = INFINITY;
  if (!NAN(dVar6)) {
    dVar11 = dVar6;
    dVar10 = dVar6;
  }
  local_118.m_hasNaN = local_118.m_hasNaN || NAN(dVar6);
  local_118.m_lo =
       (double)(~-(ulong)(dVar14 <= dVar10) & (ulong)dVar10 |
               (ulong)dVar14 & -(ulong)(dVar14 <= dVar10));
  local_118.m_hi =
       (double)(~-(ulong)(dVar11 <= dVar16) & (ulong)dVar11 |
               (ulong)dVar16 & -(ulong)(dVar11 <= dVar16));
  tcu::ScopedRoundingMode::~ScopedRoundingMode(&tmp_ctx_);
  bVar4 = false;
  if ((local_210 != -INFINITY) && (bVar4 = false, local_208 != INFINITY)) {
    bVar4 = ic.m_hi != INFINITY && ic.m_lo != -INFINITY;
  }
  tcu::FloatFormat::roundOut((Interval *)&tmp_ctx_,this,&local_118,bVar4);
  tcu::FloatFormat::convert(in_RDI,this,(Interval *)&tmp_ctx_);
  return extraout_XMM0_Qa;
}

Assistant:

static tcu::Interval fma (glu::Precision precision, float a, float b, float c)
	{
		const tcu::FloatFormat formats[] =
		{
			//				 minExp		maxExp		mantissa	exact,		subnormals	infinities	NaN
			tcu::FloatFormat(0,			0,			7,			false,		tcu::YES,	tcu::MAYBE,	tcu::MAYBE),
			tcu::FloatFormat(-13,		13,			9,			false,		tcu::MAYBE,	tcu::MAYBE,	tcu::MAYBE),
			tcu::FloatFormat(-126,		127,		23,			true,		tcu::MAYBE, tcu::YES,	tcu::MAYBE)
		};
		const tcu::FloatFormat&	format	= de::getSizedArrayElement<glu::PRECISION_LAST>(formats, precision);
		const tcu::Interval		ia		= format.convert(a);
		const tcu::Interval		ib		= format.convert(b);
		const tcu::Interval		ic		= format.convert(c);
		tcu::Interval			prod0;
		tcu::Interval			prod1;
		tcu::Interval			prod2;
		tcu::Interval			prod3;
		tcu::Interval			prod;
		tcu::Interval			res;

		TCU_SET_INTERVAL(prod0, tmp, tmp = ia.lo() * ib.lo());
		TCU_SET_INTERVAL(prod1, tmp, tmp = ia.lo() * ib.hi());
		TCU_SET_INTERVAL(prod2, tmp, tmp = ia.hi() * ib.lo());
		TCU_SET_INTERVAL(prod3, tmp, tmp = ia.hi() * ib.hi());

		prod = format.convert(format.roundOut(prod0 | prod1 | prod2 | prod3, ia.isFinite() && ib.isFinite()));

		TCU_SET_INTERVAL_BOUNDS(res, tmp,
								tmp = prod.lo() + ic.lo(),
								tmp = prod.hi() + ic.hi());

		return format.convert(format.roundOut(res, prod.isFinite() && ic.isFinite()));
	}